

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool ParseList(TidyDocImpl *doc,TidyOptionImpl *option)

{
  TidyConfigChangeCallback p_Var1;
  tchar tVar2;
  Bool BVar3;
  bool bVar4;
  Bool fire_callback;
  TidyOptionValue *val;
  uint c2;
  TidyOptionValue *oldval;
  tmbstr oldbuff;
  TidyConfigChangeCallback callback;
  int local_430;
  uint c;
  uint nItems;
  uint i;
  tmbchar buf [1024];
  TidyConfigImpl *cfg;
  TidyOptionImpl *option_local;
  TidyDocImpl *doc_local;
  
  buf._1016_8_ = &doc->config;
  c = 0;
  local_430 = 0;
  p_Var1 = doc->pConfigChangeCallback;
  oldval = (TidyOptionValue *)0x0;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if (p_Var1 != (TidyConfigChangeCallback)0x0) {
    oldval = (TidyOptionValue *)prvTidytmbstrdup(doc->allocator,(doc->config).value[option->id].p);
  }
  SetOptionValue(doc,option->id,(ctmbstr)0x0);
  if (*(int *)(buf._1016_8_ + 0x694) == -1) {
    doc_local._4_4_ = yes;
  }
  else {
    callback._4_4_ = SkipWhite((TidyConfigImpl *)buf._1016_8_);
    do {
      if (((callback._4_4_ == 0x20) || (callback._4_4_ == 9)) || (callback._4_4_ == 0x2c)) {
        callback._4_4_ = AdvanceChar((TidyConfigImpl *)buf._1016_8_);
      }
      else {
        if ((callback._4_4_ == 0xd) || (callback._4_4_ == 10)) {
          tVar2 = AdvanceChar((TidyConfigImpl *)buf._1016_8_);
          bVar4 = callback._4_4_ == 0xd;
          callback._4_4_ = tVar2;
          if ((bVar4) && (tVar2 == 10)) {
            callback._4_4_ = AdvanceChar((TidyConfigImpl *)buf._1016_8_);
          }
          BVar3 = prvTidyIsWhite(callback._4_4_);
          if (BVar3 == no) {
            *(undefined1 *)((long)&nItems + (ulong)c) = 0;
            prvTidyUngetChar(callback._4_4_,*(StreamIn **)(buf._1016_8_ + 0x698));
            prvTidyUngetChar(10,*(StreamIn **)(buf._1016_8_ + 0x698));
            break;
          }
        }
        while( true ) {
          bVar4 = false;
          if ((c < 0x3fe) && (bVar4 = false, callback._4_4_ != 0xffffffff)) {
            BVar3 = prvTidyIsWhite(callback._4_4_);
            bVar4 = false;
            if (BVar3 == no) {
              bVar4 = callback._4_4_ != 0x2c;
            }
          }
          if (!bVar4) break;
          *(char *)((long)&nItems + (ulong)c) = (char)callback._4_4_;
          callback._4_4_ = AdvanceChar((TidyConfigImpl *)buf._1016_8_);
          c = c + 1;
        }
        *(undefined1 *)((long)&nItems + (ulong)c) = 0;
        if (c != 0) {
          prvTidyDeclareListItem(doc,option,(ctmbstr)&nItems);
          c = 0;
          local_430 = local_430 + 1;
        }
      }
    } while (callback._4_4_ != 0xffffffff);
    if (c != 0) {
      prvTidyDeclareListItem(doc,option,(ctmbstr)&nItems);
    }
    if (p_Var1 != (TidyConfigChangeCallback)0x0) {
      BVar3 = OptionChangedValuesDiffer((doc->config).value[option->id].p,(ctmbstr)&oldval->v);
      doc->pConfigChangeCallback = p_Var1;
      if (oldval != (TidyOptionValue *)0x0) {
        (*doc->allocator->vtbl->free)(doc->allocator,oldval);
      }
      if (BVar3 != no) {
        PerformOptionChangedCallback(doc,option);
      }
    }
    doc_local._4_4_ = (Bool)(local_430 != 0);
  }
  return doc_local._4_4_;
}

Assistant:

Bool ParseList( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    tmbchar buf[1024];
    uint i = 0, nItems = 0;
    uint c;
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    tmbstr oldbuff = NULL;

    /* Handle comparing before and after for the config change callback.
       We have do handle this manually, because otherwise TY_(DeclareListItem)
       would fire a callback for EVERY list item being added. */
    doc->pConfigChangeCallback = NULL;
    if ( callback )
    {
        TidyOptionValue* oldval = &(doc->config.value[ option->id ]);
        oldbuff = TY_(tmbstrdup)( doc->allocator, oldval->p );
    }

    SetOptionValue( doc, option->id, NULL );

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
        return yes;

    c = SkipWhite( cfg );

    do
    {
        if (c == ' ' || c == '\t' || c == ',')
        {
            c = AdvanceChar( cfg );
            continue;
        }

        if ( c == '\r' || c == '\n' )
        {
            uint c2 = AdvanceChar( cfg );
            if ( c == '\r' && c2 == '\n' )
                c = AdvanceChar( cfg );
            else
                c = c2;

            if ( !TY_(IsWhite)(c) )
            {
                buf[i] = 0;
                TY_(UngetChar)( c, cfg->cfgIn );
                TY_(UngetChar)( '\n', cfg->cfgIn );
                break;
            }
        }

        while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) && c != ',' )
        {
            buf[i++] = (tmbchar) c;
            c = AdvanceChar( cfg );
        }

        buf[i] = '\0';
        if (i == 0)          /* Skip empty attribute definition. Possible when */
            continue;        /* there is a trailing space on the line. */

        /* add attribute to array */
        TY_(DeclareListItem)( doc, option, buf );

        i = 0;
        ++nItems;
    }
    while ( c != EndOfStream );

    if ( i > 0 )
        TY_(DeclareListItem)( doc, option, buf );

    /* If there's a callback, compare the old and new values, and fire
       the callback appropriately. */
    if ( callback )
    {
        TidyOptionValue* val = &(doc->config.value[ option->id ]);
        Bool fire_callback = OptionChangedValuesDiffer( val->p, oldbuff);

        doc->pConfigChangeCallback = callback;

        if ( oldbuff )
            TidyFree( doc->allocator, oldbuff );

        if ( fire_callback )
            PerformOptionChangedCallback( doc, option );
    }

    return ( nItems > 0 );
}